

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O3

char * get_token_to_eol(char *buf,char *buf_end,char **token,size_t *token_len,int *ret)

{
  long lVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  lVar1 = -(long)buf;
  pbVar3 = (byte *)buf;
  while (7 < (long)(buf_end + lVar1)) {
    bVar2 = *pbVar3;
    if (bVar2 - 0x7f < 0xffffffa1) {
LAB_0010c0b5:
      if ((bVar2 < 0x20) && (bVar2 != 9)) goto LAB_0010c0ee;
      if (bVar2 == 0x7f) goto LAB_0010c130;
      pbVar3 = pbVar3 + 1;
    }
    else {
      bVar2 = pbVar3[1];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 1;
        goto LAB_0010c0b5;
      }
      bVar2 = pbVar3[2];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 2;
        goto LAB_0010c0b5;
      }
      bVar2 = pbVar3[3];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 3;
        goto LAB_0010c0b5;
      }
      bVar2 = pbVar3[4];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 4;
        goto LAB_0010c0b5;
      }
      bVar2 = pbVar3[5];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 5;
        goto LAB_0010c0b5;
      }
      bVar2 = pbVar3[6];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 6;
        goto LAB_0010c0b5;
      }
      bVar2 = pbVar3[7];
      if (bVar2 - 0x7f < 0xffffffa1) {
        pbVar3 = pbVar3 + 7;
        goto LAB_0010c0b5;
      }
      pbVar3 = pbVar3 + 8;
    }
    lVar1 = -(long)pbVar3;
  }
  for (; pbVar3 != (byte *)buf_end; pbVar3 = pbVar3 + 1) {
    bVar2 = *pbVar3;
    if (bVar2 - 0x7f < 0xffffffa1) {
      if ((bVar2 < 0x20) && (bVar2 != 9)) goto LAB_0010c0ee;
      if (bVar2 == 0x7f) goto LAB_0010c130;
    }
  }
LAB_0010c10e:
  *ret = -2;
  return (char *)0x0;
LAB_0010c0ee:
  if (bVar2 == 0xd) {
    if (pbVar3 + 1 == (byte *)buf_end) goto LAB_0010c10e;
    if (pbVar3[1] == 10) {
      pbVar4 = pbVar3 + 2;
      *token_len = (long)pbVar3 - (long)buf;
      goto LAB_0010c10a;
    }
  }
  else if (bVar2 == 10) {
    *token_len = (long)pbVar3 - (long)buf;
    pbVar4 = pbVar3 + 1;
LAB_0010c10a:
    *token = buf;
    return (char *)pbVar4;
  }
LAB_0010c130:
  *ret = -1;
  return (char *)0x0;
}

Assistant:

static const char *get_token_to_eol(const char *buf, const char *buf_end, const char **token, size_t *token_len, int *ret)
{
    const char *token_start = buf;

#ifdef __SSE4_2__
    static const char ALIGNED(16) ranges1[16] = "\0\010"    /* allow HT */
                                                "\012\037"  /* allow SP and up to but not including DEL */
                                                "\177\177"; /* allow chars w. MSB set */
    int found;
    buf = findchar_fast(buf, buf_end, ranges1, 6, &found);
    if (found)
        goto FOUND_CTL;
#else
    /* find non-printable char within the next 8 bytes, this is the hottest code; manually inlined */
    while (likely(buf_end - buf >= 8)) {
#define DOIT()                                                                                                                     \
    do {                                                                                                                           \
        if (unlikely(!IS_PRINTABLE_ASCII(*buf)))                                                                                   \
            goto NonPrintable;                                                                                                     \
        ++buf;                                                                                                                     \
    } while (0)
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
#undef DOIT
        continue;
    NonPrintable:
        if ((likely((unsigned char)*buf < '\040') && likely(*buf != '\011')) || unlikely(*buf == '\177')) {
            goto FOUND_CTL;
        }
        ++buf;
    }
#endif
    for (;; ++buf) {
        CHECK_EOF();
        if (unlikely(!IS_PRINTABLE_ASCII(*buf))) {
            if ((likely((unsigned char)*buf < '\040') && likely(*buf != '\011')) || unlikely(*buf == '\177')) {
                goto FOUND_CTL;
            }
        }
    }
FOUND_CTL:
    if (likely(*buf == '\015')) {
        ++buf;
        EXPECT_CHAR('\012');
        *token_len = buf - 2 - token_start;
    } else if (*buf == '\012') {
        *token_len = buf - token_start;
        ++buf;
    } else {
        *ret = -1;
        return NULL;
    }
    *token = token_start;

    return buf;
}